

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

_Bool rifiuti_init(rbin_type type,char *usage_param,char *usage_summary,char ***argv,GError **error)

{
  _Bool _Var1;
  GPtrArray *pGVar2;
  GHashTable *pGVar3;
  GOptionContext *local_38;
  GOptionContext *context;
  GError **error_local;
  char ***argv_local;
  char *usage_summary_local;
  char *usage_param_local;
  rbin_type type_local;
  
  context = (GOptionContext *)error;
  error_local = (GError **)argv;
  argv_local = (char ***)usage_summary;
  usage_summary_local = usage_param;
  usage_param_local._4_4_ = type;
  setlocale(6,"");
  init_handles();
  meta = (metarecord *)g_malloc0(0x38);
  pGVar2 = (GPtrArray *)g_ptr_array_new();
  meta->records = pGVar2;
  g_ptr_array_set_free_func(meta->records,_free_record_cb);
  pGVar3 = (GHashTable *)g_hash_table_new_full(g_str_hash,g_str_equal,g_free,g_error_free);
  meta->invalid_records = pGVar3;
  allidxfiles = (GPtrArray *)g_ptr_array_new_with_free_func(g_free);
  local_38 = (GOptionContext *)g_option_context_new(usage_summary_local);
  g_option_context_set_summary(local_38,argv_local);
  _opt_ctxt_setup(&local_38,usage_param_local._4_4_);
  _Var1 = _opt_ctxt_parse(&local_38,(char ***)error_local,(GError **)context);
  return _Var1;
}

Assistant:

bool
rifiuti_init (rbin_type  type,
              char      *usage_param,
              char      *usage_summary,
              char    ***argv,
              GError   **error)
{
    GOptionContext *context;

    setlocale (LC_ALL, "");
    init_handles ();

    /* Initialize metadata struct */
    meta = g_malloc0 (sizeof (metarecord));
    meta->records = g_ptr_array_new ();
    g_ptr_array_set_free_func (meta->records, (GDestroyNotify) _free_record_cb);
    meta->invalid_records = g_hash_table_new_full (
        g_str_hash,
        g_str_equal,
        (GDestroyNotify) g_free,
        (GDestroyNotify) g_error_free
    );

    // Other global structures
    allidxfiles = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    /* Parse command line arguments and generate help */
    context = g_option_context_new (usage_param);
    g_option_context_set_summary (context, usage_summary);
    _opt_ctxt_setup (&context, type);

    return _opt_ctxt_parse (&context, argv, error);
}